

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandFoundDiscoveredDependency
          (BuildSystemFrontendDelegate *this,Command *param_1,StringRef param_2,
          DiscoveredDependencyKind param_3)

{
  return;
}

Assistant:

void BuildSystemFrontendDelegate::commandCannotBuildOutputDueToMissingInputs(
     Command * command, Node *output, ArrayRef<BuildKey> inputs) {
  std::string message;
  llvm::raw_string_ostream messageStream(message);

  messageStream << "cannot build '";
  messageStream << output->getName().str();
  messageStream << "' due to missing inputs: ";

  for (size_t i = 0; i < inputs.size(); ++i) {
    if (i > 0) {
      messageStream << ", ";
    }
    messageStream << "'" << (inputs[i].isNode() ? inputs[i].getNodeName().str() : inputs[i].getKeyData().str()) << "'";
  }

  messageStream.flush();
  fwrite(message.data(), message.size(), 1, stderr);
  fflush(stderr);
}